

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ymt.cpp
# Opt level: O3

void ymt::UpdateUsers(void)

{
  pointer pcVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  size_t stop;
  long *plVar5;
  undefined8 uVar6;
  _Alloc_hider _Var7;
  long lVar8;
  pointer this;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  YAML l;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  yaml_content;
  Parser user;
  Parser default_config;
  allocator_type local_601;
  YAML local_600;
  string local_5b8;
  string local_598;
  string local_578;
  string local_558;
  string local_538;
  string local_518;
  string local_4f8;
  string local_4d8;
  string local_4b8;
  string local_498;
  string local_478;
  string local_458;
  string local_438;
  string local_418;
  string local_3f8;
  string local_3d8;
  string local_3b8;
  string local_398;
  pointer local_378;
  string local_370;
  string local_350;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_330;
  undefined1 local_318 [32];
  _Alloc_hider local_2f8;
  char local_2e8 [16];
  _Alloc_hider local_2d8;
  char local_2c8 [16];
  _Alloc_hider local_2b8;
  char local_2a8 [16];
  _Alloc_hider local_298;
  char local_288 [16];
  _Alloc_hider local_278;
  char local_268 [16];
  _Alloc_hider local_258;
  char local_248 [16];
  _Alloc_hider local_238;
  char local_228 [16];
  _Alloc_hider local_218 [2];
  long local_208 [11];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1b0;
  Parser local_198;
  
  Parser::Parser(&local_198);
  local_350._M_dataplus._M_p = (pointer)&local_350.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_350,config__abi_cxx11_._M_dataplus._M_p,
             config__abi_cxx11_._M_dataplus._M_p + config__abi_cxx11_._M_string_length);
  util::ReadFile(&local_330,&local_350);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_350._M_dataplus._M_p != &local_350.field_2) {
    operator_delete(local_350._M_dataplus._M_p,local_350.field_2._M_allocated_capacity + 1);
  }
  local_378 = local_330.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  if (local_330.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_330.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    this = local_330.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
    do {
      if (this->_M_string_length != 0) {
        stop = std::__cxx11::string::find((char *)this,0x117e40,0);
        if (stop != 0xffffffffffffffff) {
          local_398._M_dataplus._M_p = (pointer)&local_398.field_2;
          pcVar1 = (this->_M_dataplus)._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_398,pcVar1,pcVar1 + this->_M_string_length);
          util::SubString((string *)local_318,&local_398,0,stop);
          std::__cxx11::string::operator=((string *)this,(string *)local_318);
          if ((undefined1 *)local_318._0_8_ != local_318 + 0x10) {
            operator_delete((void *)local_318._0_8_,local_318._16_8_ + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_398._M_dataplus._M_p != &local_398.field_2) {
            operator_delete(local_398._M_dataplus._M_p,local_398.field_2._M_allocated_capacity + 1);
          }
        }
        if (this->_M_string_length != 0) {
          local_3b8._M_dataplus._M_p = (pointer)&local_3b8.field_2;
          pcVar1 = (this->_M_dataplus)._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_3b8,pcVar1,pcVar1 + this->_M_string_length);
          util::DecodeYamlLine(&local_600,&local_3b8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3b8._M_dataplus._M_p != &local_3b8.field_2) {
            operator_delete(local_3b8._M_dataplus._M_p,local_3b8.field_2._M_allocated_capacity + 1);
          }
          if (local_600.level == 0) {
            local_438._M_dataplus._M_p = (pointer)&local_438.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_438,local_600.left._M_dataplus._M_p,
                       local_600.left._M_dataplus._M_p + local_600.left._M_string_length);
            local_318._0_8_ = local_318 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_318,"group","");
            local_2f8._M_p = local_2e8;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f8,"nameserver","");
            local_2d8._M_p = local_2c8;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d8,"method","");
            local_2b8._M_p = local_2a8;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b8,"fastopen","");
            local_298._M_p = local_288;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_298,"redirect","");
            local_278._M_p = local_268;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_278,"timeout","");
            local_258._M_p = local_248;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,"server","");
            local_238._M_p = local_228;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"tunnel_mode","");
            local_218[0]._M_p = (pointer)local_208;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_218,"verbose","");
            __l._M_len = 9;
            __l._M_array = (iterator)local_318;
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::vector(&local_1b0,__l,&local_601);
            iVar4 = util::MatchWithWords(&local_438,&local_1b0);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&local_1b0);
            lVar8 = -0x120;
            plVar5 = local_208;
            do {
              if (plVar5 != (long *)plVar5[-2]) {
                operator_delete((long *)plVar5[-2],*plVar5 + 1);
              }
              plVar5 = plVar5 + -4;
              lVar8 = lVar8 + 0x20;
            } while (lVar8 != 0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_438._M_dataplus._M_p != &local_438.field_2) {
              operator_delete(local_438._M_dataplus._M_p,local_438.field_2._M_allocated_capacity + 1
                             );
            }
            switch(iVar4) {
            case 0:
              local_458._M_dataplus._M_p = (pointer)&local_458.field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_458,local_600.right._M_dataplus._M_p,
                         local_600.right._M_dataplus._M_p + local_600.right._M_string_length);
              Parser::SetAttribute(&local_198,GROUP_NAME,&local_458);
              uVar6 = local_458.field_2._M_allocated_capacity;
              _Var7._M_p = local_458._M_dataplus._M_p;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_458._M_dataplus._M_p != &local_458.field_2) {
LAB_0010e296:
                operator_delete(_Var7._M_p,uVar6 + 1);
              }
              break;
            case 1:
              local_478._M_dataplus._M_p = (pointer)&local_478.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_478,"localhost","");
              local_3d8._M_dataplus._M_p = (pointer)&local_3d8.field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_3d8,local_600.right._M_dataplus._M_p,
                         local_600.right._M_dataplus._M_p + local_600.right._M_string_length);
              bVar2 = util::IsTheSame(&local_478,&local_3d8,false,false);
              bVar3 = true;
              if (!bVar2) {
                local_498._M_dataplus._M_p = (pointer)&local_498.field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_498,"bind9-local","");
                local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_3f8,local_600.right._M_dataplus._M_p,
                           local_600.right._M_dataplus._M_p + local_600.right._M_string_length);
                bVar3 = util::IsTheSame(&local_498,&local_3f8,false,false);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
                  operator_delete(local_3f8._M_dataplus._M_p,
                                  local_3f8.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_498._M_dataplus._M_p != &local_498.field_2) {
                  operator_delete(local_498._M_dataplus._M_p,
                                  local_498.field_2._M_allocated_capacity + 1);
                }
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_3d8._M_dataplus._M_p != &local_3d8.field_2) {
                operator_delete(local_3d8._M_dataplus._M_p,
                                local_3d8.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_478._M_dataplus._M_p != &local_478.field_2) {
                operator_delete(local_478._M_dataplus._M_p,
                                local_478.field_2._M_allocated_capacity + 1);
              }
              if (bVar3 == false) {
                local_4b8._M_dataplus._M_p = (pointer)&local_4b8.field_2;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_4b8,local_600.right._M_dataplus._M_p,
                           local_600.right._M_dataplus._M_p + local_600.right._M_string_length);
                Parser::SetAttribute(&local_198,DNS,&local_4b8);
                uVar6 = local_4b8.field_2._M_allocated_capacity;
                _Var7._M_p = local_4b8._M_dataplus._M_p;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_4b8._M_dataplus._M_p != &local_4b8.field_2) goto LAB_0010e296;
              }
              else {
                util::GetMachineIP_abi_cxx11_();
                Parser::SetAttribute(&local_198,DNS,&local_370);
                uVar6 = local_370.field_2._M_allocated_capacity;
                _Var7._M_p = local_370._M_dataplus._M_p;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_370._M_dataplus._M_p != &local_370.field_2) goto LAB_0010e296;
              }
              break;
            case 2:
              local_4d8._M_dataplus._M_p = (pointer)&local_4d8.field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_4d8,local_600.right._M_dataplus._M_p,
                         local_600.right._M_dataplus._M_p + local_600.right._M_string_length);
              Parser::SetAttribute(&local_198,METHOD,&local_4d8);
              uVar6 = local_4d8.field_2._M_allocated_capacity;
              _Var7._M_p = local_4d8._M_dataplus._M_p;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_4d8._M_dataplus._M_p != &local_4d8.field_2) goto LAB_0010e296;
              break;
            case 3:
              local_4f8._M_dataplus._M_p = (pointer)&local_4f8.field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_4f8,local_600.right._M_dataplus._M_p,
                         local_600.right._M_dataplus._M_p + local_600.right._M_string_length);
              Parser::SetAttribute(&local_198,TCP_FASTOPEN,&local_4f8);
              uVar6 = local_4f8.field_2._M_allocated_capacity;
              _Var7._M_p = local_4f8._M_dataplus._M_p;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_4f8._M_dataplus._M_p != &local_4f8.field_2) goto LAB_0010e296;
              break;
            case 4:
              local_518._M_dataplus._M_p = (pointer)&local_518.field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_518,local_600.right._M_dataplus._M_p,
                         local_600.right._M_dataplus._M_p + local_600.right._M_string_length);
              Parser::SetAttribute(&local_198,REDIRECT,&local_518);
              uVar6 = local_518.field_2._M_allocated_capacity;
              _Var7._M_p = local_518._M_dataplus._M_p;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_518._M_dataplus._M_p != &local_518.field_2) goto LAB_0010e296;
              break;
            case 5:
              local_538._M_dataplus._M_p = (pointer)&local_538.field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_538,local_600.right._M_dataplus._M_p,
                         local_600.right._M_dataplus._M_p + local_600.right._M_string_length);
              Parser::SetAttribute(&local_198,TIMEOUT,&local_538);
              uVar6 = local_538.field_2._M_allocated_capacity;
              _Var7._M_p = local_538._M_dataplus._M_p;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_538._M_dataplus._M_p != &local_538.field_2) goto LAB_0010e296;
              break;
            case 6:
              local_558._M_dataplus._M_p = (pointer)&local_558.field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_558,local_600.right._M_dataplus._M_p,
                         local_600.right._M_dataplus._M_p + local_600.right._M_string_length);
              Parser::SetAttribute(&local_198,SERVER,&local_558);
              uVar6 = local_558.field_2._M_allocated_capacity;
              _Var7._M_p = local_558._M_dataplus._M_p;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_558._M_dataplus._M_p != &local_558.field_2) goto LAB_0010e296;
              break;
            case 7:
              local_578._M_dataplus._M_p = (pointer)&local_578.field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_578,local_600.right._M_dataplus._M_p,
                         local_600.right._M_dataplus._M_p + local_600.right._M_string_length);
              Parser::SetAttribute(&local_198,UDP_OR_TCP,&local_578);
              uVar6 = local_578.field_2._M_allocated_capacity;
              _Var7._M_p = local_578._M_dataplus._M_p;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_578._M_dataplus._M_p != &local_578.field_2) goto LAB_0010e296;
              break;
            case 8:
              local_598._M_dataplus._M_p = (pointer)&local_598.field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_598,local_600.right._M_dataplus._M_p,
                         local_600.right._M_dataplus._M_p + local_600.right._M_string_length);
              Parser::SetAttribute(&local_198,VERBOSE,&local_598);
              uVar6 = local_598.field_2._M_allocated_capacity;
              _Var7._M_p = local_598._M_dataplus._M_p;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_598._M_dataplus._M_p != &local_598.field_2) goto LAB_0010e296;
            }
          }
          else {
            Parser::Parser((Parser *)local_318,&local_198);
            local_5b8._M_dataplus._M_p = (pointer)&local_5b8.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_5b8,local_600.left._M_dataplus._M_p,
                       local_600.left._M_dataplus._M_p + local_600.left._M_string_length);
            local_418._M_dataplus._M_p = (pointer)&local_418.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_418,local_600.right._M_dataplus._M_p,
                       local_600.right._M_dataplus._M_p + local_600.right._M_string_length);
            Parser::SetUser((Parser *)local_318,&local_5b8,&local_418);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_418._M_dataplus._M_p != &local_418.field_2) {
              operator_delete(local_418._M_dataplus._M_p,local_418.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_5b8._M_dataplus._M_p != &local_5b8.field_2) {
              operator_delete(local_5b8._M_dataplus._M_p,local_5b8.field_2._M_allocated_capacity + 1
                             );
            }
            std::vector<Parser,_std::allocator<Parser>_>::push_back(&users_,(value_type *)local_318)
            ;
            Parser::~Parser((Parser *)local_318);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_600.right._M_dataplus._M_p != &local_600.right.field_2) {
            operator_delete(local_600.right._M_dataplus._M_p,
                            local_600.right.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_600.left._M_dataplus._M_p != &local_600.left.field_2) {
            operator_delete(local_600.left._M_dataplus._M_p,
                            local_600.left.field_2._M_allocated_capacity + 1);
          }
        }
      }
      this = this + 1;
    } while (this != local_378);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_330);
  Parser::~Parser(&local_198);
  return;
}

Assistant:

void ymt::UpdateUsers() {

	//Make template configuration (Can be modified by config)
	Parser default_config;

	//Read raw config
	vector <string> yaml_content = util::ReadFile(config_);

	//Parse YAML
	for (string& line : yaml_content) {

		//Skip blanklines & comments
		if (line.empty()) continue;
		else {
			size_t slash_pos = line.find("//");
			if (slash_pos != -1) {
				line = util::SubString(line, 0, slash_pos);
			}
			if (line.empty()) continue;
		}


		YAML l = util::DecodeYamlLine(line);

		//If it is global level -- no user
		if (l.level == 0) {
			switch (util::MatchWithWords(l.left,
										 { "group",
										  "nameserver",
										  "method",
										  "fastopen",
										  "redirect",
										  "timeout",
										  "server",
										  "tunnel_mode",
										  "verbose" })) {
			case 0:
				default_config.SetAttribute(GROUP_NAME, l.right);
				break;
			case 1:
				if (util::IsTheSame("localhost", l.right, false, false) ||
					util::IsTheSame("bind9-local", l.right, false, false)) {
					default_config.SetAttribute(DNS, util::GetMachineIP());
				}
				else {
					default_config.SetAttribute(DNS, l.right);
				}
				break;
			case 2:
				default_config.SetAttribute(METHOD, l.right);
				break;
			case 3:
				default_config.SetAttribute(TCP_FASTOPEN, l.right);
				break;
			case 4:
				default_config.SetAttribute(REDIRECT, l.right);
				break;
			case 5:
				default_config.SetAttribute(TIMEOUT, l.right);
				break;
			case 6:
				default_config.SetAttribute(SERVER, l.right);
				break;
			case 7:
				default_config.SetAttribute(UDP_OR_TCP, l.right);
				break;
			case 8:
				default_config.SetAttribute(VERBOSE, l.right);
				break;

			default:
				break;
			}
		}
		else {
			Parser user = default_config;
			user.SetUser(l.left, l.right);
			users_.push_back(user);
		}
	}
}